

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

int Curl_conn_get_stream_error(Curl_easy *data,connectdata *conn,int sockindex)

{
  Curl_cfilter *pCVar1;
  uint in_EAX;
  CURLcode CVar2;
  bool bVar3;
  int n;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  pCVar1 = conn->cfilter[sockindex];
  if (pCVar1 == (Curl_cfilter *)0x0) {
    bVar3 = true;
  }
  else {
    CVar2 = (*pCVar1->cft->query)(pCVar1,data,6,(int *)((long)&uStack_8 + 4),(void *)0x0);
    bVar3 = CVar2 != CURLE_OK;
  }
  if (uStack_8._4_4_ < 1) {
    uStack_8._4_4_ = 0;
  }
  if (bVar3) {
    uStack_8._4_4_ = 0;
  }
  return uStack_8._4_4_;
}

Assistant:

int Curl_conn_get_stream_error(struct Curl_easy *data,
                               struct connectdata *conn,
                               int sockindex)
{
  CURLcode result;
  int n = 0;

  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  result = cf ? cf->cft->query(cf, data, CF_QUERY_STREAM_ERROR,
                               &n, NULL) : CURLE_UNKNOWN_OPTION;
  return (result || n < 0) ? 0 : n;
}